

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

_Bool ImGui::NavScoreItem(ImGuiNavItemData *result)

{
  ImVec2 IVar1;
  ImGuiNavLayer IVar2;
  uint uVar3;
  ImGuiWindow_conflict *pIVar4;
  ImGuiWindow_conflict *pIVar5;
  bool bVar6;
  ImGuiContext_conflict1 *pIVar7;
  _Bool _Var8;
  ImRect *pIVar9;
  uint uVar10;
  float *pfVar11;
  float *pfVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  pIVar7 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  IVar2 = GImGui->NavLayer;
  if (IVar2 != (pIVar4->DC).NavLayerCurrent) {
    return false;
  }
  local_8 = (GImGui->LastItemData).NavRect.Min.x;
  fStack_4 = (GImGui->LastItemData).NavRect.Min.y;
  local_10 = (GImGui->LastItemData).NavRect.Max.x;
  fStack_c = (GImGui->LastItemData).NavRect.Max.y;
  fVar17 = (GImGui->NavScoringRect).Min.x;
  fVar15 = (GImGui->NavScoringRect).Min.y;
  fVar14 = (GImGui->NavScoringRect).Max.x;
  fVar16 = (GImGui->NavScoringRect).Max.y;
  GImGui->NavScoringDebugCount = GImGui->NavScoringDebugCount + 1;
  pIVar5 = pIVar7->NavWindow;
  if (pIVar4->ParentWindow == pIVar5) {
    if (((uint)(pIVar5->Flags | pIVar4->Flags) >> 0x17 & 1) == 0) {
      __assert_fail("(window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x252a,"bool ImGui::NavScoreItem(ImGuiNavItemData *)");
    }
    if ((pIVar4->ClipRect).Max.y <= fStack_4) {
      return false;
    }
    fVar18 = (pIVar4->ClipRect).Min.y;
    if (fStack_c <= fVar18) {
      return false;
    }
    if ((pIVar4->ClipRect).Max.x <= local_8) {
      return false;
    }
    fVar19 = (pIVar4->ClipRect).Min.x;
    if (local_10 <= fVar19) {
      return false;
    }
    IVar1 = (pIVar4->ClipRect).Max;
    fVar20 = IVar1.x;
    fVar21 = IVar1.y;
    fVar22 = fVar18;
    if ((fVar18 <= fStack_4) && (fVar22 = fVar21, fStack_4 <= fVar21)) {
      fVar22 = fStack_4;
    }
    fStack_4 = fVar22;
    fVar22 = fVar20;
    if (local_8 <= fVar20) {
      fVar22 = local_8;
    }
    local_8 = (float)(-(uint)(local_8 < fVar19) & (uint)fVar19 |
                     ~-(uint)(local_8 < fVar19) & (uint)fVar22);
    if ((fVar18 <= fStack_c) && (fVar18 = fVar21, fStack_c <= fVar21)) {
      fVar18 = fStack_c;
    }
    if (local_10 <= fVar20) {
      fVar20 = local_10;
    }
    local_10 = (float)(-(uint)(local_10 < fVar19) & (uint)fVar19 |
                      ~-(uint)(local_10 < fVar19) & (uint)fVar20);
    fStack_c = fVar18;
  }
  if ((uint)pIVar7->NavMoveClipDir < 2) {
    pfVar11 = &fStack_c;
    pfVar12 = &fStack_4;
    lVar13 = 0xc;
    pIVar9 = (ImRect *)&(pIVar4->ClipRect).Min.y;
    fVar18 = fStack_c;
    fVar19 = fStack_4;
  }
  else {
    pfVar12 = &local_8;
    lVar13 = 8;
    pfVar11 = &local_10;
    pIVar9 = &pIVar4->ClipRect;
    fVar18 = local_10;
    fVar19 = local_8;
  }
  fVar20 = (pIVar9->Min).x;
  fVar22 = *(float *)((long)&(pIVar4->ClipRect).Min.x + lVar13);
  fVar21 = fVar22;
  if (fVar19 <= fVar22) {
    fVar21 = fVar19;
  }
  *pfVar12 = (float)(-(uint)(fVar19 < fVar20) & (uint)fVar20 |
                    ~-(uint)(fVar19 < fVar20) & (uint)fVar21);
  if (fVar18 <= fVar22) {
    fVar22 = fVar18;
  }
  *pfVar11 = (float)(-(uint)(fVar18 < fVar20) & (uint)fVar20 |
                    ~-(uint)(fVar18 < fVar20) & (uint)fVar22);
  if (fVar17 <= local_10) {
    fVar18 = 0.0;
    if (fVar14 < local_8) {
      fVar18 = local_8 - fVar14;
    }
  }
  else {
    fVar18 = local_10 - fVar17;
  }
  fVar22 = fVar16 - fVar15;
  fVar19 = (fStack_c - fStack_4) * 0.8 + fStack_4;
  fVar20 = fVar22 * 0.2 + fVar15;
  if (fVar20 <= fVar19) {
    fVar19 = (fStack_c - fStack_4) * 0.2 + fStack_4;
    fVar20 = fVar22 * 0.8 + fVar15;
    if (fVar20 < fVar19) {
      fVar19 = fVar19 - fVar20;
      goto LAB_001e6013;
    }
    fVar19 = 0.0;
    bVar6 = false;
  }
  else {
    fVar19 = fVar19 - fVar20;
LAB_001e6013:
    bVar6 = fVar19 != 0.0;
    if (((fVar18 != 0.0) || (NAN(fVar18))) && ((fVar19 != 0.0 || (NAN(fVar19))))) {
      fVar18 = fVar18 / 1000.0 + *(float *)(&DAT_002756d0 + (ulong)(0.0 < fVar18) * 4);
      bVar6 = true;
    }
  }
  fVar14 = (local_8 + local_10) - (fVar17 + fVar14);
  fVar17 = (fStack_4 + fStack_c) - (fVar15 + fVar16);
  fVar15 = ABS(fVar19) + ABS(fVar18);
  fVar16 = ABS(fVar14) + ABS(fVar17);
  if (bVar6) {
LAB_001e60d3:
    fVar20 = fVar15;
    uVar10 = (uint)(0.0 < fVar18);
    fVar17 = fVar19;
    fVar14 = fVar18;
    if (ABS(fVar18) <= ABS(fVar19)) {
      uVar10 = 0.0 < fVar19 | 2;
    }
  }
  else {
    if ((fVar18 != 0.0) || (NAN(fVar18))) goto LAB_001e60d3;
    if ((((fVar14 != 0.0) || (NAN(fVar14))) || (fVar17 != 0.0)) || (NAN(fVar17))) {
      fVar20 = fVar16;
      uVar10 = 0.0 < fVar17 | 2;
      if (ABS(fVar17) < ABS(fVar14)) {
        uVar10 = (uint)(0.0 < fVar14);
      }
    }
    else {
      fVar20 = 0.0;
      uVar10 = (uint)(pIVar7->NavId <= (pIVar7->LastItemData).ID);
      fVar17 = 0.0;
      fVar14 = 0.0;
    }
  }
  uVar3 = pIVar7->NavMoveDir;
  fVar22 = result->DistBox;
  if (uVar10 == uVar3) {
    if (fVar15 < fVar22) {
      result->DistBox = fVar15;
      result->DistCenter = fVar16;
      return true;
    }
    if ((fVar15 == fVar22) && (!NAN(fVar15) && !NAN(fVar22))) {
      fVar15 = result->DistCenter;
      if (fVar16 < fVar15) {
        result->DistCenter = fVar16;
LAB_001e6180:
        _Var8 = true;
        goto LAB_001e6186;
      }
      if ((fVar16 == fVar15) && (!NAN(fVar16) && !NAN(fVar15))) {
        if ((uVar10 & 2) == 0) {
          fVar19 = fVar18;
        }
        if (fVar19 < 0.0) goto LAB_001e6180;
      }
    }
  }
  _Var8 = false;
LAB_001e6186:
  if (fVar22 != 3.4028235e+38) {
    return _Var8;
  }
  if (NAN(fVar22)) {
    return _Var8;
  }
  if (IVar2 != ImGuiNavLayer_Menu) {
    return _Var8;
  }
  if (fVar20 < result->DistAxial) {
    if ((pIVar5->Flags & 0x10000000) != 0) {
      return _Var8;
    }
    if ((((uVar3 != 0) || (0.0 <= fVar14)) && ((uVar3 != 1 || (fVar14 <= 0.0)))) &&
       ((uVar3 != 2 || (0.0 <= fVar17)))) {
      if (uVar3 != 3) {
        return _Var8;
      }
      if (fVar17 <= 0.0) {
        return _Var8;
      }
    }
    result->DistAxial = fVar20;
    return true;
  }
  return _Var8;
}

Assistant:

static bool ImGui::NavScoreItem(ImGuiNavItemData* result)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    // FIXME: Those are not good variables names
    ImRect cand = g.LastItemData.NavRect;   // Current item nav rectangle
    const ImRect curr = g.NavScoringRect;   // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringDebugCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Overlaps(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensure that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
        dbx = (dbx / 1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (g.LastItemData.ID < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max - ImVec2(4, 4), cand.Max + CalcTextSize(buf) + ImVec2(4, 4), IM_COL32(40,0,0,150));
        draw_list->AddText(cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
#endif

    // Is it in the quadrant we're interesting in moving to?
    bool new_best = false;
    const ImGuiDir move_dir = g.NavMoveDir;
    if (quadrant == move_dir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((move_dir == ImGuiDir_Up || move_dir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == ImGuiNavLayer_Menu && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((move_dir == ImGuiDir_Left && dax < 0.0f) || (move_dir == ImGuiDir_Right && dax > 0.0f) || (move_dir == ImGuiDir_Up && day < 0.0f) || (move_dir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}